

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavesplit.cpp
# Opt level: O3

void banner(FILE *stream)

{
  undefined8 uVar1;
  
  uVar1 = ASDCP::Version();
  fprintf((FILE *)stream,
          "\n%s (asdcplib %s)\n\nCopyright (c) 2005-2009 John Hurst\n\n%s is part of asdcplib.\nasdcplib may be copied only under the terms of the license found at\nthe top of every file in the asdcplib distribution kit.\n\nSpecify the -h (help) option for further information about %s\n\n"
          ,"wavesplit",uVar1,"wavesplit","wavesplit");
  return;
}

Assistant:

void
banner(FILE* stream = stderr)
{
  fprintf(stream, "\n\
%s (asdcplib %s)\n\n\
Copyright (c) 2005-2009 John Hurst\n\n\
%s is part of asdcplib.\n\
asdcplib may be copied only under the terms of the license found at\n\
the top of every file in the asdcplib distribution kit.\n\n\
Specify the -h (help) option for further information about %s\n\n",
	  PROGRAM_NAME, ASDCP::Version(), PROGRAM_NAME, PROGRAM_NAME);
}